

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O3

Vec_Int_t * Wlc_NtkFindUifableMultiplierPairs(Wlc_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  Wlc_Obj_t *pWVar3;
  Wlc_Obj_t *pWVar4;
  int iVar5;
  Vec_Int_t *__ptr;
  Vec_Int_t *p_00;
  int *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  __ptr = Wlc_NtkCollectMultipliers(p);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  p_00->pArray = piVar6;
  lVar7 = (long)__ptr->nSize;
  piVar6 = __ptr->pArray;
  if (lVar7 < 1) {
    if (piVar6 == (int *)0x0) goto LAB_0037dfde;
  }
  else {
    lVar8 = 0;
    do {
      iVar1 = piVar6[lVar8];
      if (((long)iVar1 < 1) || (p->nObjsAlloc <= iVar1)) {
LAB_0037e01d:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar3 = p->pObjs;
      lVar9 = 0;
      do {
        iVar2 = piVar6[lVar9];
        if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_0037e01d;
        if (lVar8 == lVar9) break;
        pWVar4 = p->pObjs;
        iVar5 = Wlc_NtkPairIsUifable(p,pWVar3 + iVar1,pWVar4 + iVar2);
        if (iVar5 != 0) {
          Vec_IntPush(p_00,(int)((ulong)((long)(pWVar3 + iVar1) - (long)p->pObjs) >> 3) *
                           -0x55555555);
          Vec_IntPush(p_00,(int)((ulong)((long)(pWVar4 + iVar2) - (long)p->pObjs) >> 3) *
                           -0x55555555);
        }
        lVar9 = lVar9 + 1;
      } while (lVar7 != lVar9);
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar7);
  }
  free(piVar6);
LAB_0037dfde:
  free(__ptr);
  if (p_00->nSize < 1) {
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
    }
    free(p_00);
    p_00 = (Vec_Int_t *)0x0;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkFindUifableMultiplierPairs( Wlc_Ntk_t * p )
{
    Vec_Int_t * vMultis = Wlc_NtkCollectMultipliers( p );
    Vec_Int_t * vPairs = Vec_IntAlloc( 2 );
    Wlc_Obj_t * pObj, * pObj2;  int i, k;
    // iterate through unique pairs
    Wlc_NtkForEachObjVec( vMultis, p, pObj, i )
        Wlc_NtkForEachObjVec( vMultis, p, pObj2, k )
        {
            if ( k == i )  
                break;
            if ( Wlc_NtkPairIsUifable( p, pObj, pObj2 ) )
            {
                Vec_IntPush( vPairs, Wlc_ObjId(p, pObj) );
                Vec_IntPush( vPairs, Wlc_ObjId(p, pObj2) );
            }
        }
    Vec_IntFree( vMultis );
    if ( Vec_IntSize( vPairs ) > 0 )
        return vPairs;
    Vec_IntFree( vPairs );
    return NULL;
}